

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

void __thiscall
QtGraphicsAnchorLayout::ParallelAnchorData::updateChildrenSizes(ParallelAnchorData *this)

{
  AnchorData *pAVar1;
  AnchorData *pAVar2;
  uint uVar3;
  bool bVar4;
  qreal qVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  pAVar1 = this->firstEdge;
  auVar7._0_8_ = (this->super_AnchorData).sizeAtMinimum;
  auVar7._8_8_ = (this->super_AnchorData).sizeAtPreferred;
  pAVar1->sizeAtMinimum = (qreal)auVar7._0_8_;
  pAVar1->sizeAtPreferred = (qreal)auVar7._8_8_;
  qVar5 = (this->super_AnchorData).sizeAtMaximum;
  pAVar1->sizeAtMaximum = qVar5;
  pAVar2 = this->secondEdge;
  bVar4 = pAVar1->from == pAVar2->from;
  if (!bVar4) {
    qVar5 = (qreal)((ulong)qVar5 ^ (ulong)DAT_005e55b0);
  }
  uVar3 = (uint)bVar4;
  auVar6._0_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar6._4_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar6._8_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar6._12_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar7 = ~auVar6 & (_DAT_005e55b0 ^ auVar7) | auVar7 & auVar6;
  pAVar2->sizeAtMinimum = (qreal)auVar7._0_8_;
  pAVar2->sizeAtPreferred = (qreal)auVar7._8_8_;
  pAVar2->sizeAtMaximum = qVar5;
  (*pAVar1->_vptr_AnchorData[2])();
  (*this->secondEdge->_vptr_AnchorData[2])();
  return;
}

Assistant:

void ParallelAnchorData::updateChildrenSizes()
{
    firstEdge->sizeAtMinimum = sizeAtMinimum;
    firstEdge->sizeAtPreferred = sizeAtPreferred;
    firstEdge->sizeAtMaximum = sizeAtMaximum;

    if (secondForward()) {
        secondEdge->sizeAtMinimum = sizeAtMinimum;
        secondEdge->sizeAtPreferred = sizeAtPreferred;
        secondEdge->sizeAtMaximum = sizeAtMaximum;
    } else {
        secondEdge->sizeAtMinimum = -sizeAtMinimum;
        secondEdge->sizeAtPreferred = -sizeAtPreferred;
        secondEdge->sizeAtMaximum = -sizeAtMaximum;
    }

    firstEdge->updateChildrenSizes();
    secondEdge->updateChildrenSizes();
}